

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O0

void deqp::gles3::Functional::eval_length_vec3(ShaderEvalContext *c)

{
  float *pfVar1;
  Type_conflict TVar2;
  undefined1 local_1c [20];
  ShaderEvalContext *c_local;
  
  local_1c._12_8_ = c;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_1c,(int)c + 0x30,2,0);
  TVar2 = tcu::length<float,3>((Vector<float,_3> *)local_1c);
  pfVar1 = tcu::Vector<float,_4>::x((Vec4 *)(local_1c._12_8_ + 0x1f0));
  *pfVar1 = TVar2;
  return;
}

Assistant:

void eval_cross_vec3 (ShaderEvalContext& c) { c.color.xyz()	= cross(c.in[0].swizzle(2, 0, 1), c.in[1].swizzle(1, 2, 0)); }